

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmTarget * __thiscall
cmMakefile::GetCustomCommandTarget
          (cmMakefile *this,string *target,cmObjectLibraryCommands objLibCommands,
          cmListFileBacktrace *lfbt)

{
  cmake *pcVar1;
  bool bVar2;
  TargetType TVar3;
  PolicyStatus PVar4;
  const_iterator cVar5;
  iterator iVar6;
  ostream *poVar7;
  PolicyID id;
  MessageType t;
  char *pcVar8;
  cmTarget *pcVar9;
  string local_1e0;
  string realTarget;
  ostringstream e;
  
  std::__cxx11::string::string((string *)&realTarget,(string *)target);
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->AliasTargets)._M_t,target);
  if ((_Rb_tree_header *)cVar5._M_node != &(this->AliasTargets)._M_t._M_impl.super__Rb_tree_header)
  {
    std::__cxx11::string::_M_assign((string *)&realTarget);
  }
  iVar6 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->Targets)._M_h,&realTarget);
  if (iVar6.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    PVar4 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0040,false);
    if (PVar4 - NEW < 3) {
      t = FATAL_ERROR;
LAB_0029725f:
      pcVar9 = FindTargetToUse(this,target,false);
      if (pcVar9 == (cmTarget *)0x0) {
        poVar7 = std::operator<<((ostream *)&e,"No TARGET \'");
        poVar7 = std::operator<<(poVar7,(string *)target);
        pcVar8 = "\' has been created in this directory.";
      }
      else {
        bVar2 = cmTarget::IsImported(pcVar9);
        if (bVar2) {
          poVar7 = std::operator<<((ostream *)&e,"TARGET \'");
          poVar7 = std::operator<<(poVar7,(string *)target);
          pcVar8 = "\' is IMPORTED and does not build here.";
        }
        else {
          poVar7 = std::operator<<((ostream *)&e,"TARGET \'");
          poVar7 = std::operator<<(poVar7,(string *)target);
          pcVar8 = "\' was not created in this directory.";
        }
      }
      std::operator<<(poVar7,pcVar8);
      pcVar1 = this->GlobalGenerator->CMakeInstance;
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(pcVar1,t,&local_1e0,lfbt);
      goto LAB_0029731e;
    }
    if (PVar4 == WARN) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1e0,(cmPolicies *)&DAT_00000028,id);
      poVar7 = std::operator<<((ostream *)&e,(string *)&local_1e0);
      std::operator<<(poVar7,"\n");
      std::__cxx11::string::~string((string *)&local_1e0);
      t = AUTHOR_WARNING;
      goto LAB_0029725f;
    }
  }
  else {
    pcVar9 = (cmTarget *)
             ((long)iVar6.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                    ._M_cur + 0x28);
    if (objLibCommands == Reject) {
      TVar3 = cmTarget::GetType(pcVar9);
      if (TVar3 == OBJECT_LIBRARY) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar7 = std::operator<<((ostream *)&e,"Target \"");
        poVar7 = std::operator<<(poVar7,(string *)target);
        std::operator<<(poVar7,
                        "\" is an OBJECT library that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands."
                       );
        pcVar1 = this->GlobalGenerator->CMakeInstance;
        std::__cxx11::stringbuf::str();
        cmake::IssueMessage(pcVar1,FATAL_ERROR,&local_1e0,lfbt);
        goto LAB_0029731e;
      }
    }
    TVar3 = cmTarget::GetType(pcVar9);
    if (TVar3 != INTERFACE_LIBRARY) goto LAB_00297335;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar7 = std::operator<<((ostream *)&e,"Target \"");
    poVar7 = std::operator<<(poVar7,(string *)target);
    std::operator<<(poVar7,
                    "\" is an INTERFACE library that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands."
                   );
    pcVar1 = this->GlobalGenerator->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmake::IssueMessage(pcVar1,FATAL_ERROR,&local_1e0,lfbt);
LAB_0029731e:
    std::__cxx11::string::~string((string *)&local_1e0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  pcVar9 = (cmTarget *)0x0;
LAB_00297335:
  std::__cxx11::string::~string((string *)&realTarget);
  return pcVar9;
}

Assistant:

cmTarget* cmMakefile::GetCustomCommandTarget(
  const std::string& target, cmObjectLibraryCommands objLibCommands,
  const cmListFileBacktrace& lfbt) const
{
  auto realTarget = target;

  auto ai = this->AliasTargets.find(target);
  if (ai != this->AliasTargets.end()) {
    realTarget = ai->second;
  }

  // Find the target to which to add the custom command.
  auto ti = this->Targets.find(realTarget);
  if (ti == this->Targets.end()) {
    MessageType messageType = MessageType::AUTHOR_WARNING;
    bool issueMessage = false;
    std::ostringstream e;
    switch (this->GetPolicyStatus(cmPolicies::CMP0040)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0040) << "\n";
        issueMessage = true;
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = MessageType::FATAL_ERROR;
        break;
    }

    if (issueMessage) {
      if (cmTarget const* t = this->FindTargetToUse(target)) {
        if (t->IsImported()) {
          e << "TARGET '" << target
            << "' is IMPORTED and does not build here.";
        } else {
          e << "TARGET '" << target << "' was not created in this directory.";
        }
      } else {
        e << "No TARGET '" << target
          << "' has been created in this directory.";
      }
      this->GetCMakeInstance()->IssueMessage(messageType, e.str(), lfbt);
    }

    return nullptr;
  }

  cmTarget* t = &ti->second;
  if (objLibCommands == cmObjectLibraryCommands::Reject &&
      t->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    std::ostringstream e;
    e << "Target \"" << target
      << "\" is an OBJECT library "
         "that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands.";
    this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                                           lfbt);
    return nullptr;
  }
  if (t->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    std::ostringstream e;
    e << "Target \"" << target
      << "\" is an INTERFACE library "
         "that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands.";
    this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                                           lfbt);
    return nullptr;
  }

  return t;
}